

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextFollowing(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNsPtr ns;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((((cur == (xmlNodePtr)0x0) || (cur->type == XML_ATTRIBUTE_NODE)) ||
           (cur->type == XML_NAMESPACE_DECL)) || (cur->children == (_xmlNode *)0x0)) {
    ns = (xmlNsPtr)cur;
    if (cur == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)ctxt->context->node;
      if (((xmlNodePtr)ns)->type == XML_ATTRIBUTE_NODE) {
        ns = (xmlNsPtr)((xmlNodePtr)ns)->parent;
      }
      else if (((xmlNodePtr)ns)->type == XML_NAMESPACE_DECL) {
        if ((((xmlNodePtr)ns)->_private == (void *)0x0) ||
           (*(int *)((long)((xmlNodePtr)ns)->_private + 8) == 0x12)) {
          return (xmlNodePtr)0x0;
        }
        ns = (xmlNsPtr)((xmlNodePtr)ns)->_private;
      }
    }
    if (ns == (xmlNsPtr)0x0) {
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else if (ns[1].next == (_xmlNs *)0x0) {
      do {
        ns = (xmlNsPtr)ns->context;
        if ((xmlDocPtr)ns == (xmlDocPtr)0x0) {
          return (xmlNodePtr)0x0;
        }
        if ((xmlDocPtr)ns == ctxt->context->doc) {
          return (xmlNodePtr)0x0;
        }
        if (((xmlDocPtr)ns)->next != (_xmlNode *)0x0) {
          return ((xmlDocPtr)ns)->next;
        }
        ctxt_local = (xmlXPathParserContextPtr)ns;
      } while ((xmlDocPtr)ns != (xmlDocPtr)0x0);
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)ns[1].next;
    }
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)cur->children;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextFollowing(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((cur != NULL) && (cur->type  != XML_ATTRIBUTE_NODE) &&
        (cur->type != XML_NAMESPACE_DECL) && (cur->children != NULL))
        return(cur->children);

    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
    }
    if (cur == NULL) return(NULL) ; /* ERROR */
    if (cur->next != NULL) return(cur->next) ;
    do {
        cur = cur->parent;
        if (cur == NULL) break;
        if (cur == (xmlNodePtr) ctxt->context->doc) return(NULL);
        if (cur->next != NULL) return(cur->next);
    } while (cur != NULL);
    return(cur);
}